

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inipp.h
# Opt level: O2

void __thiscall inipp::Ini<char>::interpolate(Ini<char> *this)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  _Base_ptr p_Var3;
  Sections *__range2;
  byte bVar4;
  uint uVar5;
  Symbols syms;
  Symbols SStack_48;
  
  p_Var1 = &(this->sections)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var3 = (this->sections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != p_Var1; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    local_symbols(&SStack_48,this,(String *)(p_Var3 + 1),(Section *)(p_Var3 + 2));
    replace_symbols(this,&SStack_48,(Section *)(p_Var3 + 2));
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&SStack_48);
  }
  uVar5 = 0;
  do {
    global_symbols_abi_cxx11_(&SStack_48,this);
    bVar4 = 0;
    for (p_Var3 = (this->sections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != p_Var1; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      bVar2 = replace_symbols(this,&SStack_48,(Section *)(p_Var3 + 2));
      bVar4 = bVar4 | bVar2;
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&SStack_48);
    bVar2 = uVar5 < 10;
    uVar5 = uVar5 + 1;
  } while ((bVar4 & bVar2) != 0);
  return;
}

Assistant:

void interpolate() {
		int global_iteration = 0;
		auto changed = false;
		// replace each "${variable}" by "${section:variable}"
		for (auto & sec : sections)
			replace_symbols(local_symbols(sec.first, sec.second), sec.second);
		// replace each "${section:variable}" by its value
		do {
			changed = false;
			const auto syms = global_symbols();
			for (auto & sec : sections)
				changed |= replace_symbols(syms, sec.second);
		} while (changed && (max_interpolation_depth > global_iteration++));
	}